

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_GetCommitment_Test::~ConfidentialValue_GetCommitment_Test
          (ConfidentialValue_GetCommitment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfidentialValue, GetCommitment) {
  ConfidentialAssetId asset_commitment(
      "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
  BlindFactor vbf(
      "fe3357df1f35df75412d9ad86ebd99e622e26019722f316027787a685e2cd71a");
  Amount amount(int64_t{13000000000000});
  ConfidentialValue commitment = ConfidentialValue::GetCommitment(
      amount, asset_commitment, vbf);
  EXPECT_STREQ(
      commitment.GetHex().c_str(),
      "08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49");
}